

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool __thiscall ghc::filesystem::path::has_filename(path *this)

{
  bool bVar1;
  bool bVar2;
  byte local_3a;
  path local_38;
  path *local_18;
  path *this_local;
  
  local_18 = this;
  bVar1 = has_relative_path(this);
  local_3a = 0;
  if (bVar1) {
    filename(&local_38,this);
    bVar2 = empty(&local_38);
    local_3a = bVar2 ^ 0xff;
  }
  this_local._7_1_ = local_3a & 1;
  if (bVar1) {
    ~path(&local_38);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

GHC_INLINE bool path::has_filename() const
{
    return has_relative_path() && !filename().empty();
}